

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O3

X509_EXTENSION * v3_generic_extension(char *ext,char *value,int crit,int gen_type,X509V3_CTX *ctx)

{
  uint uVar1;
  ASN1_OBJECT *obj;
  uchar *data;
  ASN1_TYPE *a;
  ASN1_OCTET_STRING *str;
  X509_EXTENSION *pXVar2;
  size_t ext_len;
  uchar *ext_der;
  size_t local_40;
  uchar *local_38;
  
  obj = OBJ_txt2obj(ext,0);
  if (obj == (ASN1_OBJECT *)0x0) {
    ERR_put_error(0x14,0,0x71,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                  ,0xe7);
    ERR_add_error_data(2,"name=",ext);
    return (X509_EXTENSION *)0x0;
  }
  local_40 = 0;
  if (gen_type == 2) {
    a = ASN1_generate_v3(value,(X509V3_CTX *)ctx);
    if (a != (ASN1_TYPE *)0x0) {
      local_38 = (uchar *)0x0;
      uVar1 = i2d_ASN1_TYPE(a,&local_38);
      ASN1_TYPE_free(a);
      if ((int)uVar1 < 0) {
        data = (uchar *)0x0;
      }
      else {
        local_40 = (size_t)uVar1;
        data = local_38;
      }
      goto LAB_0048c9d6;
    }
  }
  else if (gen_type == 1) {
    data = x509v3_hex_to_bytes(value,&local_40);
LAB_0048c9d6:
    if (data != (uchar *)0x0) {
      if (local_40 >> 0x1f == 0) {
        str = ASN1_OCTET_STRING_new();
        if (str != (ASN1_OCTET_STRING *)0x0) {
          ASN1_STRING_set0(str,data,(int)local_40);
          pXVar2 = X509_EXTENSION_create_by_OBJ((X509_EXTENSION **)0x0,obj,crit,str);
          ASN1_STRING_free(str);
          goto LAB_0048ca82;
        }
      }
      else {
        ERR_put_error(0x14,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                      ,0xfb);
      }
      OPENSSL_free(data);
      pXVar2 = (X509_EXTENSION *)0x0;
      goto LAB_0048ca82;
    }
  }
  pXVar2 = (X509_EXTENSION *)0x0;
  ERR_put_error(0x14,0,0x74,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                ,0xf5);
  ERR_add_error_data(2,"value=",value);
LAB_0048ca82:
  ASN1_OBJECT_free(obj);
  return (X509_EXTENSION *)pXVar2;
}

Assistant:

static X509_EXTENSION *v3_generic_extension(const char *ext, const char *value,
                                            int crit, int gen_type,
                                            const X509V3_CTX *ctx) {
  bssl::UniquePtr<ASN1_OBJECT> obj(OBJ_txt2obj(ext, 0));
  if (obj == nullptr) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_NAME_ERROR);
    ERR_add_error_data(2, "name=", ext);
    return nullptr;
  }

  bssl::UniquePtr<unsigned char> ext_der;
  size_t ext_len = 0;
  if (gen_type == 1) {
    ext_der.reset(x509v3_hex_to_bytes(value, &ext_len));
  } else if (gen_type == 2) {
    ext_der.reset(generic_asn1(value, ctx, &ext_len));
  }

  if (ext_der == nullptr) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_VALUE_ERROR);
    ERR_add_error_data(2, "value=", value);
    return nullptr;
  }

  if (ext_len > INT_MAX) {
    OPENSSL_PUT_ERROR(X509V3, ERR_R_OVERFLOW);
    return nullptr;
  }

  bssl::UniquePtr<ASN1_OCTET_STRING> oct(ASN1_OCTET_STRING_new());
  if (oct == nullptr) {
    return nullptr;
  }

  ASN1_STRING_set0(oct.get(), ext_der.get(), (int)ext_len);
  ext_der.release();  // ASN1_STRING_set0 took ownership.

  return X509_EXTENSION_create_by_OBJ(nullptr, obj.get(), crit, oct.get());
}